

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

ReduceSumSquareLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_reducesumsquare
          (NeuralNetworkLayer *this)

{
  bool bVar1;
  Arena *arena;
  ReduceSumSquareLayerParams *pRVar2;
  NeuralNetworkLayer *this_local;
  
  bVar1 = _internal_has_reducesumsquare(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_reducesumsquare(this);
    arena = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    pRVar2 = google::protobuf::MessageLite::
             CreateMaybeMessage<CoreML::Specification::ReduceSumSquareLayerParams>(arena);
    (this->layer_).reducesumsquare_ = pRVar2;
  }
  return (ReduceSumSquareLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::ReduceSumSquareLayerParams* NeuralNetworkLayer::_internal_mutable_reducesumsquare() {
  if (!_internal_has_reducesumsquare()) {
    clear_layer();
    set_has_reducesumsquare();
    layer_.reducesumsquare_ = CreateMaybeMessage< ::CoreML::Specification::ReduceSumSquareLayerParams >(GetArenaForAllocation());
  }
  return layer_.reducesumsquare_;
}